

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O1

int __thiscall BenevolentBotStrategy::fortifyFromCountryIndex(BenevolentBotStrategy *this)

{
  int iVar1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar2;
  pointer ppCVar3;
  Country *pCVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  
  pvVar2 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
  ppCVar3 = (pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar6 = (long)(pvVar2->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 3;
    uVar7 = 0;
    iVar8 = -1;
    uVar5 = 0;
    do {
      pCVar4 = ppCVar3[uVar7];
      iVar1 = *pCVar4->pNumberOfTroops;
      if (iVar8 < iVar1) {
        (this->super_PlayerStrategy).from = pCVar4;
        uVar5 = uVar7 & 0xffffffff;
        iVar8 = iVar1;
      }
      uVar7 = uVar7 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != uVar7);
    return (int)uVar5;
  }
  return 0;
}

Assistant:

int BenevolentBotStrategy::fortifyFromCountryIndex() {
    unsigned int fromCountryIndex = 0;
    int numTroops = -1;
    for(int i = 0; i < player->getOwnedCountries()->size(); i++){
        if(player->getOwnedCountries()->at(i)->getNumberOfTroops() > numTroops){
            fromCountryIndex = i;
            numTroops = player->getOwnedCountries()->at(i)->getNumberOfTroops();
            from = player->getOwnedCountries()->at(i);
        }
    }
    return (int) fromCountryIndex;
}